

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O2

void __thiscall
SolverAppOptionParserTest_ShowUsageIfNoFilename_Test::
~SolverAppOptionParserTest_ShowUsageIfNoFilename_Test
          (SolverAppOptionParserTest_ShowUsageIfNoFilename_Test *this)

{
  SolverAppOptionParserTest::~SolverAppOptionParserTest(&this->super_SolverAppOptionParserTest);
  operator_delete(this,0x428);
  return;
}

Assistant:

TEST_F(SolverAppOptionParserTest, ShowUsageIfNoFilename) {
  Args args("unused");
  char **argp = args, **argp_copy = argp;
  EXPECT_EQ(0, parser_.Parse(argp_copy));
  EXPECT_EQ(argp + 1, argp_copy);
  EXPECT_THAT(handler_.output, StartsWith("usage: solver-name "));

  // Test the same, but with some options.
  handler_.output.clear();
  EXPECT_EQ(0, parser_.Parse(Args("unused", "-e", "-s")));
  EXPECT_THAT(handler_.output, StartsWith("usage: solver-name "));
}